

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_dynamic_dofs_waypoints.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  Result RVar2;
  ostream *poVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  vector<double,_std::allocator<double>_> *local_bb8;
  string local_b70;
  double local_b50;
  double calculation_duration;
  undefined8 uStack_b40;
  undefined8 local_b38;
  iterator local_b28;
  undefined8 local_b20;
  double local_b18 [4];
  iterator local_af8;
  undefined8 local_af0;
  double local_ae8 [4];
  iterator local_ac8;
  undefined8 local_ac0;
  double local_ab8 [4];
  iterator local_a98;
  undefined8 local_a90;
  double local_a88 [4];
  iterator local_a68;
  undefined8 local_a60;
  double local_a58 [3];
  iterator local_a40;
  undefined8 local_a38;
  undefined1 local_a2a;
  allocator<double> local_a29;
  double local_a28 [3];
  iterator local_a10;
  size_type local_a08;
  allocator<double> local_9f9;
  double local_9f8 [3];
  iterator local_9e0;
  size_type local_9d8;
  allocator<double> local_9c9;
  double local_9c8 [3];
  iterator local_9b0;
  size_type local_9a8;
  allocator<double> local_999;
  double local_998 [3];
  iterator local_980;
  size_type local_978;
  vector<double,_std::allocator<double>_> *local_970;
  vector<double,_std::allocator<double>_> local_968;
  vector<double,_std::allocator<double>_> local_950;
  vector<double,_std::allocator<double>_> local_938;
  vector<double,_std::allocator<double>_> local_920;
  vector<double,_std::allocator<double>_> local_908;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  pointer *local_8d8;
  undefined8 local_8d0;
  double local_8c8 [4];
  iterator local_8a8;
  undefined8 local_8a0;
  double local_898 [3];
  iterator local_880;
  undefined8 local_878;
  undefined1 local_870 [8];
  OutputParameter<0UL,_ruckig::StandardVector> output;
  undefined1 local_760 [8];
  InputParameter<0UL,_ruckig::StandardVector> input;
  Ruckig<0UL,_ruckig::StandardVector,_false> otg;
  size_t max_number_of_waypoints;
  size_t DOFs;
  double control_cycle;
  
  ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::Ruckig<0UL,_0>
            ((Ruckig<0UL,_ruckig::StandardVector,_false> *)
             &input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>._M_engaged,3,0.01,10);
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::InputParameter<0UL,_0>
            ((InputParameter<0UL,_ruckig::StandardVector> *)local_760,3);
  ruckig::OutputParameter<0UL,_ruckig::StandardVector>::OutputParameter<0UL,_0>
            ((OutputParameter<0UL,_ruckig::StandardVector> *)local_870,3,10);
  local_898[0] = 0.2;
  local_898[1] = 0.0;
  local_898[2] = -0.3;
  local_880 = local_898;
  local_878 = 3;
  __l_12._M_len = 3;
  __l_12._M_array = local_880;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&input.duration_discretization,__l_12);
  local_8c8[0] = 0.0;
  local_8c8[1] = 0.2;
  local_8c8[2] = 0.0;
  local_8a8 = local_8c8;
  local_8a0 = 3;
  __l_11._M_len = 3;
  __l_11._M_array = local_8a8;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.current_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_11);
  local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_8f0 = 0x3fe3333333333333;
  local_8e8 = 0;
  local_8d8 = &local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  local_8d0 = 3;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)local_8d8;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.current_velocity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_10);
  local_a2a = 1;
  local_998[2] = 1.0;
  local_998[0] = 1.4;
  local_998[1] = -1.6;
  local_980 = local_998;
  local_978 = 3;
  local_970 = &local_968;
  std::allocator<double>::allocator(&local_999);
  __l_08._M_len = local_978;
  __l_08._M_array = local_980;
  std::vector<double,_std::allocator<double>_>::vector(&local_968,__l_08,&local_999);
  local_9c8[2] = 0.4;
  local_9c8[0] = -0.6;
  local_9c8[1] = -0.5;
  local_9b0 = local_9c8;
  local_9a8 = 3;
  local_970 = &local_950;
  std::allocator<double>::allocator(&local_9c9);
  __l_07._M_len = local_9a8;
  __l_07._M_array = local_9b0;
  std::vector<double,_std::allocator<double>_>::vector(&local_950,__l_07,&local_9c9);
  local_9f8[0] = -0.4;
  local_9f8[1] = -0.35;
  local_9f8[2] = 0.0;
  local_9e0 = local_9f8;
  local_9d8 = 3;
  local_970 = &local_938;
  std::allocator<double>::allocator(&local_9f9);
  __l_06._M_len = local_9d8;
  __l_06._M_array = local_9e0;
  std::vector<double,_std::allocator<double>_>::vector(&local_938,__l_06,&local_9f9);
  local_a28[2] = -0.1;
  local_a28[0] = 0.8;
  local_a28[1] = 1.8;
  local_a10 = local_a28;
  local_a08 = 3;
  local_970 = &local_920;
  std::allocator<double>::allocator(&local_a29);
  __l_05._M_len = local_a08;
  __l_05._M_array = local_a10;
  std::vector<double,_std::allocator<double>_>::vector(&local_920,__l_05,&local_a29);
  local_a2a = 0;
  local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_968;
  local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4;
  __l_09._M_len = 4;
  __l_09._M_array =
       (iterator)
       local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&input.min_acceleration.
                  super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
                  .super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>.
                  _M_engaged,__l_09);
  pvVar4 = &local_968;
  local_bb8 = &local_908;
  do {
    local_bb8 = local_bb8 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_bb8);
  } while (local_bb8 != pvVar4);
  std::allocator<double>::~allocator(&local_a29);
  std::allocator<double>::~allocator(&local_9f9);
  std::allocator<double>::~allocator(&local_9c9);
  std::allocator<double>::~allocator(&local_999);
  local_a58[0] = 0.5;
  local_a58[1] = 1.0;
  local_a58[2] = 0.0;
  local_a40 = local_a58;
  local_a38 = 3;
  __l_04._M_len = 3;
  __l_04._M_array = local_a40;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.current_acceleration.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,__l_04);
  local_a88[0] = 0.2;
  local_a88[1] = 0.0;
  local_a88[2] = 0.3;
  local_a68 = local_a88;
  local_a60 = 3;
  __l_03._M_len = 3;
  __l_03._M_array = local_a68;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.target_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_03);
  local_ab8[0] = 0.0;
  local_ab8[1] = 0.1;
  local_ab8[2] = -0.1;
  local_a98 = local_ab8;
  local_a90 = 3;
  __l_02._M_len = 3;
  __l_02._M_array = local_a98;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.target_velocity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_02);
  local_ae8[0] = 1.0;
  local_ae8[1] = 2.0;
  local_ae8[2] = 1.0;
  local_ac8 = local_ae8;
  local_ac0 = 3;
  __l_01._M_len = 3;
  __l_01._M_array = local_ac8;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.target_acceleration.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_01);
  local_b18[0] = 3.0;
  local_b18[1] = 2.0;
  local_b18[2] = 2.0;
  local_af8 = local_b18;
  local_af0 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_af8;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.max_velocity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_00);
  calculation_duration = 6.0;
  uStack_b40 = 0x4024000000000000;
  local_b38 = 0x4034000000000000;
  local_b28 = &calculation_duration;
  local_b20 = 3;
  __l._M_len = 3;
  __l._M_array = local_b28;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &input.max_acceleration.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l);
  poVar3 = std::operator<<((ostream *)&std::cout,"t | position");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_b50 = 0.0;
  while (RVar2 = ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::update
                           ((Ruckig<0UL,_ruckig::StandardVector,_false> *)
                            &input.interrupt_calculation_duration.
                             super__Optional_base<double,_true,_true>._M_payload.
                             super__Optional_payload_base<double>._M_engaged,
                            (InputParameter<0UL,_ruckig::StandardVector> *)local_760,
                            (OutputParameter<0UL,_ruckig::StandardVector> *)local_870),
        RVar2 == Working) {
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        (double)output.new_jerk.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar3 = std::operator<<(poVar3," | ");
    ruckig::join<std::vector<double,std::allocator<double>>>
              (&local_b70,(ruckig *)&output.trajectory.degrees_of_freedom,
               (vector<double,_std::allocator<double>_> *)0x0,SUB81(pvVar4,0));
    poVar3 = std::operator<<(poVar3,(string *)&local_b70);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_b70);
    ruckig::OutputParameter<0UL,_ruckig::StandardVector>::pass_to_input
              ((OutputParameter<0UL,_ruckig::StandardVector> *)local_870,
               (InputParameter<0UL,_ruckig::StandardVector> *)local_760);
    if ((output.new_section._1_1_ & 1) != 0) {
      local_b50 = (double)output._240_8_;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Reached target position in ");
  dVar1 = ruckig::Trajectory<0UL,_ruckig::StandardVector>::get_duration
                    ((Trajectory<0UL,_ruckig::StandardVector> *)&output);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3," [s].");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Calculation in ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_b50);
  poVar3 = std::operator<<(poVar3,anon_var_dwarf_223ba);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  ruckig::OutputParameter<0UL,_ruckig::StandardVector>::~OutputParameter
            ((OutputParameter<0UL,_ruckig::StandardVector> *)local_870);
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<0UL,_ruckig::StandardVector> *)local_760);
  ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::~Ruckig
            ((Ruckig<0UL,_ruckig::StandardVector,_false> *)
             &input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>._M_engaged);
  return 0;
}

Assistant:

int main() {
    double control_cycle = 0.01;
    size_t DOFs = 3;
    size_t max_number_of_waypoints = 10;  // for memory allocation

    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<DynamicDOFs> otg(DOFs, control_cycle, max_number_of_waypoints);
    InputParameter<DynamicDOFs> input(DOFs);
    OutputParameter<DynamicDOFs> output(DOFs, max_number_of_waypoints);

    // Set input parameters
    input.current_position = {0.2, 0.0, -0.3};
    input.current_velocity = {0.0, 0.2, 0.0};
    input.current_acceleration = {0.0, 0.6, 0.0};

    input.intermediate_positions = {
        {1.4, -1.6, 1.0},
        {-0.6, -0.5, 0.4},
        {-0.4, -0.35, 0.0},
        {0.8, 1.8, -0.1}
    };

    input.target_position = {0.5, 1.0, 0.0};
    input.target_velocity = {0.2, 0.0, 0.3};
    input.target_acceleration = {0.0, 0.1, -0.1};

    input.max_velocity = {1.0, 2.0, 1.0};
    input.max_acceleration = {3.0, 2.0, 2.0};
    input.max_jerk = {6.0, 10.0, 20.0};

    std::cout << "t | position" << std::endl;
    double calculation_duration = 0.0;
    while (otg.update(input, output) == Result::Working) {
        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);

        if (output.new_calculation) {
            calculation_duration = output.calculation_duration;
        }
    }

    std::cout << "Reached target position in " << output.trajectory.get_duration() << " [s]." << std::endl;
    std::cout << "Calculation in " << calculation_duration << " [µs]." << std::endl;
}